

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O2

void __thiscall license::test::MyGlobalFixture::setup(MyGlobalFixture *this)

{
  bool bVar1;
  string sVar2;
  log_level lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  path local_b0;
  path pkf;
  path local_70;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  local_d0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
  ;
  local_d0._M_string_length = 0x426153;
  local_d0.field_2._M_allocated_capacity = 0x1d;
  lVar3 = boost::unit_test::unit_test_log_t::operator<<
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&local_d0);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_f0,lVar3);
  pkf.m_pathname._M_string_length._0_1_ = 0;
  pkf.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0054cc08;
  pkf.m_pathname.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pkf.m_pathname.field_2._8_8_ = anon_var_dwarf_f1e6;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_f0,(lazy_ostream *)&pkf);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_f0);
  bVar1 = boost::filesystem::exists((path *)project_path);
  if (bVar1) {
    boost::filesystem::remove_all((path *)project_path);
  }
  sVar2 = (string)boost::filesystem::create_directories((path *)licenses_path);
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x22);
  local_b0.m_pathname._M_string_length = 0;
  local_b0.m_pathname.field_2._M_allocated_capacity = 0;
  local_b0.m_pathname._M_dataplus._M_p._0_1_ = sVar2;
  std::__cxx11::string::string((string *)&local_f0,"Error creating ",(allocator *)&local_70);
  std::operator+(&local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)licenses_path)
  ;
  pkf.m_pathname._M_string_length._0_1_ = 0;
  pkf.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0054cb70;
  pkf.m_pathname.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
  ;
  local_48 = "";
  pkf.m_pathname.field_2._8_8_ = &local_d0;
  boost::test_tools::tt_detail::report_assertion(&local_b0,&pkf,&local_50,0x22,2,1,0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_b0.m_pathname.field_2._M_allocated_capacity);
  boost::filesystem::path::path
            ((path *)&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test"
            );
  boost::filesystem::path::path(&local_b0,"data");
  boost::filesystem::operator/((path *)&local_d0,(path *)&local_f0,&local_b0);
  boost::filesystem::path::path(&local_70,"private_key.rsa");
  boost::filesystem::operator/(&pkf,(path *)&local_d0,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  boost::filesystem::path::path((path *)&local_f0,"private_key.rsa");
  boost::filesystem::operator/((path *)&local_d0,(path *)project_path,(path *)&local_f0);
  boost::filesystem::copy_file(&pkf,(path *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&pkf);
  return;
}

Assistant:

void setup() {
		BOOST_TEST_MESSAGE("setup temp project ");
		if (fs::exists(project_path)) {
			fs::remove_all(project_path);
		}
		bool ok = fs::create_directories(licenses_path);
		BOOST_REQUIRE_MESSAGE(ok, string("Error creating ") + licenses_path.string());
		fs::path pkf = fs::path(PROJECT_TEST_SRC_DIR) / "data" / PRIVATE_KEY_FNAME;
		fs::copy_file(pkf, project_path / PRIVATE_KEY_FNAME);
	}